

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

void ReadRequestHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs
                       )

{
  mapped_type *ppAVar1;
  ostream *poVar2;
  long in_RCX;
  undefined4 *in_RDX;
  undefined8 in_RSI;
  _ReadResponseMsg Response;
  ssize_t ret;
  char *pointer;
  size_t remaining;
  char *tmp;
  Remote_evpath_state *ev_state;
  AnonSimpleFile *f;
  ReadRequestMsg ReadMsg;
  uint64_t in_stack_00000138;
  key_type *in_stack_ffffffffffffff18;
  unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
  *in_stack_ffffffffffffff20;
  string local_b8 [32];
  undefined4 local_98 [2];
  undefined8 local_90;
  undefined1 local_88;
  long local_80;
  void *local_78;
  ssize_t local_70;
  void *local_68;
  long local_60;
  void *local_58;
  rep local_50;
  long local_48;
  undefined8 local_40;
  mapped_type local_38;
  undefined4 *local_30;
  long local_20;
  undefined8 local_10;
  
  local_40 = *(undefined8 *)(in_RDX + 2);
  local_30 = in_RDX;
  local_20 = in_RCX;
  local_10 = in_RSI;
  ppAVar1 = std::
            unordered_map<unsigned_long,_AnonSimpleFile_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_AnonSimpleFile_*>_>_>
            ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_38 = *ppAVar1;
  local_48 = local_20;
  last_service_time.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_50 = (rep)last_service_time.__d.__r;
  if (local_38->m_CurrentOffset != *(size_t *)(local_30 + 4)) {
    lseek(local_38->m_FileDescriptor,*(__off_t *)(local_30 + 4),0);
    local_38->m_CurrentOffset = *(size_t *)(local_30 + 4);
  }
  local_68 = malloc(*(size_t *)(local_30 + 6));
  local_60 = *(long *)(local_30 + 6);
  local_58 = local_68;
  while( true ) {
    if (local_60 == 0) {
      local_38->m_CurrentOffset = *(long *)(local_30 + 6) + local_38->m_CurrentOffset;
      memset(local_98,0,0x28);
      local_80 = *(long *)(local_30 + 6);
      local_78 = local_58;
      local_98[0] = *local_30;
      local_90 = *(undefined8 *)(local_30 + 8);
      local_88 = 0x7f;
      if (1 < verbose) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Returning ");
        readable_size_abi_cxx11_(in_stack_00000138);
        poVar2 = std::operator<<(poVar2,local_b8);
        poVar2 = std::operator<<(poVar2," for Read ");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_b8);
      }
      local_38->m_BytesSent = local_80 + local_38->m_BytesSent;
      local_38->m_OperationCount = local_38->m_OperationCount + 1;
      TotalSimpleBytesSent = local_80 + TotalSimpleBytesSent;
      TotalSimpleReads = TotalSimpleReads + 1;
      CMwrite(local_10,*(undefined8 *)(local_48 + 0x38),local_98);
      free(local_58);
      return;
    }
    local_70 = read(local_38->m_FileDescriptor,local_68,(long)(int)local_60);
    if (local_70 < 1) break;
    local_60 = local_60 - local_70;
    local_68 = (void *)(local_70 + (long)local_68);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Read failed! BAD!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  free(local_58);
  return;
}

Assistant:

static void ReadRequestHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                               attr_list attrs)
{
    ReadRequestMsg ReadMsg = static_cast<ReadRequestMsg>(vevent);
    AnonSimpleFile *f = SimpleFileMap[ReadMsg->FileHandle];
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    last_service_time = std::chrono::steady_clock::now();
    if (f->m_CurrentOffset != ReadMsg->Offset)
    {
        lseek(f->m_FileDescriptor, (long)ReadMsg->Offset, SEEK_SET);
        f->m_CurrentOffset = ReadMsg->Offset;
    }
    char *tmp = (char *)malloc(ReadMsg->Size);
    size_t remaining = ReadMsg->Size;
    char *pointer = tmp;
    while (remaining > 0)
    {
        ssize_t ret = read(f->m_FileDescriptor, pointer, (int)remaining);
        if (ret <= 0)
        {
            // EOF or error,  should send a message back, but we haven't define error handling yet
            std::cout << "Read failed! BAD!" << std::endl;
            // instead free tmp and return;
            free(tmp);
            return;
        }
        else
        {
            remaining -= ret;
            pointer += ret;
        }
    }
    f->m_CurrentOffset += ReadMsg->Size;
    _ReadResponseMsg Response;
    memset(&Response, 0, sizeof(Response));
    Response.Size = ReadMsg->Size;
    Response.ReadData = (char *)tmp;
    Response.ReadResponseCondition = ReadMsg->ReadResponseCondition;
    Response.Dest = ReadMsg->Dest;
    Response.OperatorType = Operator::OperatorType::COMPRESS_NULL;
    if (verbose >= 2)
        std::cout << "Returning " << readable_size(Response.Size) << " for Read " << std::endl;
    f->m_BytesSent += Response.Size;
    f->m_OperationCount++;
    TotalSimpleBytesSent += Response.Size;
    TotalSimpleReads++;
    CMwrite(conn, ev_state->ReadResponseFormat, &Response);
    free(tmp);
}